

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O2

void __thiscall
DIS::LinearObjectStatePdu::marshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  double *pdVar1;
  pointer pLVar2;
  long lVar3;
  ulong uVar4;
  LinearSegmentParameter x;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_linearSegmentParameters).
                            super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_linearSegmentParameters).
                           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x68));
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  ObjectType::marshal(&this->_objectType,dataStream);
  lVar3 = 0x58;
  uVar4 = 0;
  while( true ) {
    pLVar2 = (this->_linearSegmentParameters).
             super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_linearSegmentParameters).
                       super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2) / 0x68) <= uVar4)
    break;
    x._vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_001b1658;
    x._segmentNumber = *(uchar *)((long)(&pLVar2->_segmentAppearance + -6) + lVar3);
    x._segmentAppearance._vptr_SixByteChunk = (_func_int **)&PTR__SixByteChunk_001b2300;
    x._segmentAppearance._otherParameters._4_2_ =
         *(undefined2 *)((pLVar2->_segmentAppearance)._otherParameters + lVar3 + 0xffffffffffffffac)
    ;
    x._segmentAppearance._otherParameters._0_4_ =
         *(undefined4 *)((long)(&pLVar2->_segmentAppearance + -5) + lVar3);
    x._location._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b2778;
    x._location._z = *(double *)((long)(&pLVar2->_segmentAppearance + -3) + lVar3);
    pdVar1 = (double *)((long)(&pLVar2->_segmentAppearance + -4) + lVar3);
    x._location._x = *pdVar1;
    x._location._y = pdVar1[1];
    x._orientation._vptr_Orientation = (_func_int **)&PTR__Orientation_001b1a40;
    x._orientation._phi =
         *(float *)((pLVar2->_segmentAppearance)._otherParameters + lVar3 + 0xffffffffffffffe0);
    x._orientation._8_8_ = *(undefined8 *)((long)(&pLVar2->_segmentAppearance + -2) + lVar3);
    x._pad1 = *(uint *)((pLVar2->_segmentAppearance)._otherParameters + lVar3 + 0xfffffffffffffff0);
    x._88_8_ = *(undefined8 *)
                ((long)&((LinearSegmentParameter *)(&pLVar2->_segmentAppearance + -1))->
                        _segmentAppearance + lVar3 + 0xfffffffffffffff0U);
    LinearSegmentParameter::marshal(&x,dataStream);
    LinearSegmentParameter::~LinearSegmentParameter(&x);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x68;
  }
  return;
}

Assistant:

void LinearObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << ( unsigned char )_linearSegmentParameters.size();
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);
    _objectType.marshal(dataStream);

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        LinearSegmentParameter x = _linearSegmentParameters[idx];
        x.marshal(dataStream);
     }

}